

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiUtil.cpp
# Opt level: O0

bool ImGui::Spinner(char *label,float radius,int thickness,ImU32 *color)

{
  bool bVar1;
  int iVar2;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float a;
  int i;
  ImVec2 centre;
  float a_max;
  float a_min;
  int start;
  int num_segments;
  ImRect bb;
  ImVec2 size;
  ImVec2 pos;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  ImDrawList *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar7;
  float in_stack_ffffffffffffff84;
  float fVar8;
  float in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImVec2 local_64;
  ImRect local_5c;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  float local_14;
  bool local_1;
  
  local_14 = in_XMM0_Da;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_3c = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78),
                                  (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70));
    local_44 = (local_28->DC).CursorPos;
    ImVec2::ImVec2(&local_4c,local_14 * 2.0,(local_14 + (local_38->FramePadding).y) * 2.0);
    ImVec2::ImVec2(&local_64,local_44.x + local_4c.x,local_44.y + local_4c.y);
    ImRect::ImRect(&local_5c,&local_44,&local_64);
    ItemSize((ImRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
    bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (ImGuiID)in_stack_ffffffffffffff84,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (bVar1) {
      ImDrawList::PathClear(local_28->DrawList);
      fVar3 = sinf((float)(local_30->Time * 1.7999999523162842));
      iVar2 = (int)(fVar3 * 25.0);
      if (iVar2 < 0) {
        iVar2 = -iVar2;
      }
      fVar3 = ((float)iVar2 * 6.2831855) / 30.0;
      fVar4 = 5.654867;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,local_44.x + local_14,
                     local_44.y + local_14 + (local_38->FramePadding).y);
      for (iVar7 = 0; iVar7 < 0x1e; iVar7 = iVar7 + 1) {
        fVar5 = ((float)iVar7 / 30.0) * (fVar4 - fVar3) + fVar3;
        in_stack_ffffffffffffff68 = local_28->DrawList;
        fVar8 = in_stack_ffffffffffffff84;
        fVar6 = cosf((float)(local_30->Time * 8.0 + (double)fVar5));
        in_stack_ffffffffffffff64 = fVar6 * local_14 + in_stack_ffffffffffffff84;
        fVar6 = in_stack_ffffffffffffff88;
        fVar5 = sinf((float)(local_30->Time * 8.0 + (double)fVar5));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff74,in_stack_ffffffffffffff64,
                       fVar5 * local_14 + in_stack_ffffffffffffff88);
        ImDrawList::PathLineTo
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff88),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff84 = fVar8;
        in_stack_ffffffffffffff88 = fVar6;
      }
      ImDrawList::PathStroke
                ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff74,iVar2),
                 (ImU32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0),in_stack_ffffffffffffff64);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Spinner(const char *label, float radius, int thickness, const ImU32 &color) {
	ImGuiWindow *window = ImGui::GetCurrentWindow();
	if (window->SkipItems)
		return false;

	ImGuiContext &g = *GImGui;
	const ImGuiStyle &style = g.Style;
	const ImGuiID id = window->GetID(label);

	ImVec2 pos = window->DC.CursorPos;
	ImVec2 size((radius)*2, (radius + style.FramePadding.y) * 2);

	const ImRect bb(pos, ImVec2(pos.x + size.x, pos.y + size.y));
	ImGui::ItemSize(bb, style.FramePadding.y);
	if (!ImGui::ItemAdd(bb, id))
		return false;

	// Render
	window->DrawList->PathClear();

	int num_segments = 30;
	int start = ImSin(g.Time * 1.8f) * float(num_segments - 5);
	start = start < 0 ? -start : start; // abs

	const float a_min = IM_PI * 2.0f * ((float)start) / (float)num_segments;
	const float a_max = IM_PI * 2.0f * ((float)num_segments - 3) / (float)num_segments;

	const ImVec2 centre = ImVec2(pos.x + radius, pos.y + radius + style.FramePadding.y);

	for (int i = 0; i < num_segments; i++) {
		const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
		window->DrawList->PathLineTo(
		    ImVec2(centre.x + ImCos(a + g.Time * 8) * radius, centre.y + ImSin(a + g.Time * 8) * radius));
	}

	window->DrawList->PathStroke(color, false, thickness);
	return true;
}